

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PMurHash.c
# Opt level: O2

void PMurHash32_test(void *key,int len,uint32_t seed,void *out)

{
  uint32_t uVar1;
  uint32_t local_30;
  uint32_t local_2c [2];
  uint32_t carry;
  
  local_2c[0] = 0;
  local_30 = seed;
  PMurHash32_Process(&local_30,local_2c,key,len);
  uVar1 = PMurHash32_Result(local_30,local_2c[0],len);
  *(uint32_t *)out = uVar1;
  return;
}

Assistant:

void PMurHash32_test(const void *key, int len, uint32_t seed, void *out)
{
  uint32_t h1=seed, carry=0;
  const uint8_t *ptr = (uint8_t*)key;
  const uint8_t *end = ptr + len;

#if 0 /* Exercise the progressive processing */
  while(ptr < end) {
    //const uint8_t *mid = ptr + rand()%(end-ptr)+1;
    const uint8_t *mid = ptr + (rand()&0xF);
    mid = mid<end?mid:end;
    PMurHash32_Process(&h1, &carry, ptr, mid-ptr);
    ptr = mid;
  }
#else
  PMurHash32_Process(&h1, &carry, ptr, (int)(end-ptr));
#endif
  h1 = PMurHash32_Result(h1, carry, len);
  *(uint32_t*)out = h1;
}